

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O0

void cmdusage(void)

{
  long lVar1;
  int local_24;
  char *pcStack_20;
  int i;
  char *s;
  jas_image_fmtinfo_t *fmtinfo;
  int fmtid;
  
  cmdinfo();
  fprintf(_stderr,"usage: %s [options]\n",cmdname);
  local_24 = 0;
  pcStack_20 = "The following options are supported:\n";
  while (pcStack_20 != (char *)0x0) {
    fprintf(_stderr,"%s",pcStack_20);
    local_24 = local_24 + 1;
    pcStack_20 = helpinfo[local_24];
  }
  fprintf(_stderr,"The following formats are supported:\n");
  fmtinfo._4_4_ = 0;
  while( true ) {
    lVar1 = jas_image_lookupfmtbyid(fmtinfo._4_4_);
    if (lVar1 == 0) break;
    fprintf(_stderr,"    %-5s    %s\n",*(undefined8 *)(lVar1 + 8),*(undefined8 *)(lVar1 + 0x18));
    fmtinfo._4_4_ = fmtinfo._4_4_ + 1;
  }
  exit(1);
}

Assistant:

void cmdusage()
{
	int fmtid;
	const jas_image_fmtinfo_t *fmtinfo;
	const char *s;
	int i;
	cmdinfo();
	fprintf(stderr, "usage: %s [options]\n", cmdname);
	for (i = 0, s = helpinfo[i]; s; ++i, s = helpinfo[i]) {
		fprintf(stderr, "%s", s);
	}
	fprintf(stderr, "The following formats are supported:\n");
	for (fmtid = 0;; ++fmtid) {
		if (!(fmtinfo = jas_image_lookupfmtbyid(fmtid))) {
			break;
		}
		fprintf(stderr, "    %-5s    %s\n", fmtinfo->name,
		  fmtinfo->desc);
	}
	exit(EXIT_FAILURE);
}